

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ObjLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar6 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  pVVar3 = p->vLevels;
  iVar4 = pVVar3->nSize;
  if ((int)uVar6 < iVar4) goto LAB_007aba79;
  iVar7 = uVar6 + 1;
  iVar1 = pVVar3->nCap;
  if ((int)uVar6 < iVar1 * 2) {
    if (iVar1 <= (int)uVar6) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar5 = (int *)realloc(pVVar3->pArray,(long)iVar1 << 3);
      }
      pVVar3->pArray = piVar5;
      iVar4 = iVar1 * 2;
LAB_007aba45:
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = iVar4;
      iVar4 = pVVar3->nSize;
    }
  }
  else if (iVar1 <= (int)uVar6) {
    if (pVVar3->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar7 << 2);
    }
    else {
      piVar5 = (int *)realloc(pVVar3->pArray,(long)iVar7 << 2);
    }
    pVVar3->pArray = piVar5;
    iVar4 = iVar7;
    goto LAB_007aba45;
  }
  if (iVar4 <= (int)uVar6) {
    memset(pVVar3->pArray + iVar4,0,(ulong)(uVar6 - iVar4) * 4 + 4);
  }
  pVVar3->nSize = iVar7;
  iVar4 = iVar7;
LAB_007aba79:
  if ((-1 < (int)uVar6) && ((int)uVar6 < iVar4)) {
    return pVVar3->pArray[uVar6 & 0x7fffffff];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Gia_ObjLevel( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Gia_ObjLevelId( p, Gia_ObjId(p,pObj) );             }